

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O0

void __thiscall wabt::GlobalImport::~GlobalImport(GlobalImport *this)

{
  GlobalImport *this_local;
  
  (this->super_ImportMixin<(wabt::ExternalKind)3>).super_Import._vptr_Import =
       (_func_int **)&PTR__GlobalImport_0049c6e8;
  Global::~Global(&this->global);
  ImportMixin<(wabt::ExternalKind)3>::~ImportMixin(&this->super_ImportMixin<(wabt::ExternalKind)3>);
  return;
}

Assistant:

explicit GlobalImport(string_view name = string_view())
      : ImportMixin<ExternalKind::Global>(), global(name) {}